

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O0

void __thiscall
TPZFrontNonSym<std::complex<double>_>::PrintGlobal
          (TPZFrontNonSym<std::complex<double>_> *this,char *name,ostream *out)

{
  ostream *poVar1;
  int64_t iVar2;
  long *plVar3;
  complex *pcVar4;
  ostream *in_RDX;
  char *in_RSI;
  long in_RDI;
  int64_t j;
  int64_t i;
  long i_00;
  long local_28;
  long local_20;
  
  poVar1 = std::operator<<(in_RDX,in_RSI);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_20 = 0; iVar2 = TPZVec<long>::NElements((TPZVec<long> *)(in_RDI + 0x80)),
      local_20 < iVar2; local_20 = local_20 + 1) {
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x80),local_20);
    if (*plVar3 != -1) {
      poVar1 = (ostream *)std::ostream::operator<<(in_RDX,local_20);
      std::operator<<(poVar1," ");
    }
  }
  std::ostream::operator<<(in_RDX,std::endl<char,std::char_traits<char>>);
  for (local_20 = 0; iVar2 = TPZVec<long>::NElements((TPZVec<long> *)(in_RDI + 0x80)),
      local_20 < iVar2; local_20 = local_20 + 1) {
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x80),local_20);
    if (*plVar3 != -1) {
      for (local_28 = 0; iVar2 = TPZVec<long>::NElements((TPZVec<long> *)(in_RDI + 0x80)),
          local_28 < iVar2; local_28 = local_28 + 1) {
        plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x80),local_28);
        if (*plVar3 != -1) {
          poVar1 = in_RDX;
          plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x80),local_20);
          i_00 = *plVar3;
          TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x80),local_28);
          pcVar4 = (complex *)
                   Element((TPZFrontNonSym<std::complex<double>_> *)poVar1,i_00,0x1d22570);
          poVar1 = std::operator<<(poVar1,pcVar4);
          std::operator<<(poVar1," ");
        }
      }
      std::ostream::operator<<(in_RDX,std::endl<char,std::char_traits<char>>);
    }
  }
  std::ostream::operator<<(in_RDX,std::endl<char,std::char_traits<char>>);
  std::ostream::flush();
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::PrintGlobal(const char *name, std::ostream& out){
	int64_t i, j;
	out << name << endl;
	for(i=0;i<this->fLocal.NElements();i++){
		if(this->fLocal[i]!=-1) out << i << " ";
	}
	out << endl;
	for(i=0;i<this->fLocal.NElements();i++){
		if(this->fLocal[i]==-1) continue;
		for(j=0;j<this->fLocal.NElements();j++){
			if(this->fLocal[j]==-1) continue;
			out << Element(this->fLocal[i],this->fLocal[j]) << " ";
		}
		out << endl;
	}
	out << endl;
	out.flush();
}